

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayoutPrivate::~QFormLayoutPrivate(QFormLayoutPrivate *this)

{
  QFormLayoutPrivate *in_RDI;
  
  ~QFormLayoutPrivate(in_RDI);
  operator_delete(in_RDI,0x168);
  return;
}

Assistant:

~QFormLayoutPrivate() { }